

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::sse2::InstanceArrayIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  ulong uVar3;
  RTCFormat RVar4;
  InstanceArray *this;
  RTCRayQueryContext *pRVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  RawBufferView *pRVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  uint uVar11;
  Accel *pAVar12;
  undefined1 auVar22 [12];
  ulong uVar13;
  long lVar14;
  uint auVar15 [1];
  float fVar16;
  uint auVar21 [1];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float in_XMM2_Da;
  float in_XMM2_Db;
  float fVar27;
  float in_XMM2_Dc;
  float fVar28;
  float in_XMM2_Dd;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [12];
  vfloat4 l02;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 in_XMM5 [16];
  float in_XMM6_Da;
  float fVar34;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar35;
  undefined1 auVar36 [12];
  uint uVar37;
  float fVar38;
  undefined1 in_XMM7 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  float in_XMM11_Da;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_XMM11_Db;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar49;
  float fVar50;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float fVar51;
  float fVar52;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float fVar53;
  float fVar54;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  RayQueryContext newcontext;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  undefined4 uStack_114;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  RTCRayQueryContext RVar17;
  
  auVar36 = in_XMM7._0_12_;
  a0.field_0._0_12_ = in_XMM1._0_12_;
  auVar32 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar12 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (pAVar12 == (Accel *)0x0) {
    return;
  }
  if (((ray->super_RayK<1>).mask & (this->super_Geometry).mask) == 0) {
    return;
  }
  pRVar5 = context->user;
  if (pRVar5->instID[0] != 0xffffffff) {
    return;
  }
  auVar15[0] = (*prim).primID_;
  auVar21[0] = (*prim).instID_;
  RVar17.instPrimID[0] = auVar15[0];
  RVar17.instID[0] = auVar21[0];
  auVar18._8_4_ = 0.0;
  auVar18._0_4_ = (float)auVar21[0];
  auVar18._4_4_ = (float)auVar15[0];
  *pRVar5 = RVar17;
  uVar13 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar6 = (this->l2w_buf).items;
    RVar4 = pRVar6->format;
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        in_XMM14_Db = *(float *)(pcVar7 + lVar14 + 0x10);
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        in_XMM14_Dc = *(float *)(pcVar7 + lVar14 + 0x20);
        a0.field_0._4_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x14);
        a0.field_0._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 4);
        a0.field_0._8_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x24);
        auVar18._4_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x18);
        auVar18._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 8);
        auVar18._8_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x28);
        auVar32._4_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x1c);
        auVar32._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0xc);
        auVar32._8_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x2c);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 4);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
        a0.field_0._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
        a0.field_0._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0xc);
        a0.field_0._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
        auVar18._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
        auVar18._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x18);
        auVar18._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
        auVar32._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar14 + 0x28);
        auVar32._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x24);
        auVar32._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x28) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        auVar23._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 4);
        auVar23._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0xc);
        fVar16 = *(float *)(pcVar7 + lVar14 + 0x2c);
        fVar46 = *(float *)(pcVar7 + lVar14 + 0x30) * *(float *)(pcVar7 + lVar14 + 0x30) +
                 fVar16 * fVar16 +
                 *(float *)(pcVar7 + lVar14 + 0x24) * *(float *)(pcVar7 + lVar14 + 0x24) +
                 *(float *)(pcVar7 + lVar14 + 0x28) * *(float *)(pcVar7 + lVar14 + 0x28);
        auVar20 = rsqrtss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
        fVar53 = auVar20._0_4_;
        auVar18._8_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 8);
        auVar18._0_8_ = *(undefined8 *)(pcVar7 + lVar14 + 0x10);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
        auVar23._12_4_ = fVar16 * (fVar53 * fVar53 * fVar46 * -0.5 * fVar53 + fVar53 * 1.5);
        auVar23._8_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x3c);
        a0.field_0._0_12_ = auVar23._0_12_;
        auVar32._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
        auVar32._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x18);
        auVar32._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        pfVar2 = (float *)(pcVar7 + lVar14);
        in_XMM14_Da = *pfVar2;
        in_XMM14_Db = pfVar2[1];
        in_XMM14_Dc = pfVar2[2];
        a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14 + 0x10),0);
        auVar18 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14 + 0x20),0);
        auVar32 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14 + 0x30),0);
      }
      goto LAB_0027774a;
    }
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM13_Db = *(float *)(pcVar7 + lVar14 + 0x10);
      in_XMM13_Da = *(float *)(pcVar7 + lVar14);
      in_XMM2_Da = *(float *)(pcVar7 + lVar14 + 4);
      in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 8);
      in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM13_Dc = *(float *)(pcVar7 + lVar14 + 0x20);
      in_XMM13_Dd = 0.0;
      in_XMM2_Db = *(float *)(pcVar7 + lVar14 + 0x14);
      in_XMM2_Dc = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM2_Dd = 0.0;
      in_XMM6_Db = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM6_Dc = *(float *)(pcVar7 + lVar14 + 0x28);
      in_XMM6_Dd = 0.0;
      in_XMM4_Db = *(float *)(pcVar7 + lVar14 + 0x1c);
      in_XMM4_Dc = *(float *)(pcVar7 + lVar14 + 0x2c);
      in_XMM4_Dd = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM13_Da = *(float *)(pcVar7 + lVar14);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 4);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
      in_XMM13_Dd = 0.0;
      in_XMM2_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM2_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
      in_XMM2_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
      in_XMM2_Dd = 0.0;
      in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM6_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
      in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      in_XMM6_Dd = 0.0;
      in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x28);
      in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x28) >> 0x20);
      in_XMM4_Dd = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 0x10);
      in_XMM6_Db = *(float *)((long)(pcVar7 + lVar14 + 0x10) + 4);
      in_XMM13_Da = *(float *)(pcVar7 + lVar14);
      in_XMM2_Db = *(float *)(pcVar7 + lVar14 + 4);
      in_XMM6_Dc = *(float *)(pcVar7 + lVar14 + 8);
      in_XMM2_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
      in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM4_Dd = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM13_Dd = *(float *)(pcVar7 + lVar14 + 0x28);
      in_XMM2_Dd = *(float *)(pcVar7 + lVar14 + 0x2c);
      fVar16 = *(float *)(pcVar7 + lVar14 + 0x30);
      fVar46 = fVar16 * fVar16 +
               in_XMM2_Dd * in_XMM2_Dd + in_XMM4_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM13_Dd;
      auVar20 = rsqrtss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
      fVar53 = auVar20._0_4_;
      in_XMM6_Dd = fVar53 * fVar53 * fVar46 * -0.5 * fVar53 + fVar53 * 1.5;
      in_XMM4_Dd = in_XMM4_Dd * in_XMM6_Dd;
      in_XMM13_Dd = in_XMM13_Dd * in_XMM6_Dd;
      in_XMM2_Dd = in_XMM2_Dd * in_XMM6_Dd;
      in_XMM6_Dd = in_XMM6_Dd * fVar16;
      in_XMM2_Dc = *(float *)(pcVar7 + lVar14 + 0x3c);
      in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      pfVar2 = (float *)(pcVar7 + lVar14);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x10);
      in_XMM2_Da = *pfVar2;
      in_XMM2_Db = pfVar2[1];
      in_XMM2_Dc = pfVar2[2];
      in_XMM2_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x20);
      in_XMM6_Da = *pfVar2;
      in_XMM6_Db = pfVar2[1];
      in_XMM6_Dc = pfVar2[2];
      in_XMM6_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x30);
      in_XMM4_Da = *pfVar2;
      in_XMM4_Db = pfVar2[1];
      in_XMM4_Dc = pfVar2[2];
      in_XMM4_Dd = pfVar2[3];
    }
    fVar49 = in_XMM13_Dd * in_XMM2_Dd + in_XMM6_Dd * in_XMM4_Dd;
    fVar46 = in_XMM13_Dd * in_XMM2_Dd - in_XMM6_Dd * in_XMM4_Dd;
    fVar53 = in_XMM4_Dd * in_XMM4_Dd - in_XMM13_Dd * in_XMM13_Dd;
    fVar39 = in_XMM4_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM13_Dd + -in_XMM2_Dd * in_XMM2_Dd +
             -in_XMM6_Dd * in_XMM6_Dd;
    fVar47 = in_XMM2_Dd * in_XMM2_Dd + fVar53 + -in_XMM6_Dd * in_XMM6_Dd;
    fVar28 = in_XMM13_Dd * in_XMM6_Dd - in_XMM2_Dd * in_XMM4_Dd;
    fVar43 = in_XMM2_Dd * in_XMM4_Dd + in_XMM13_Dd * in_XMM6_Dd;
    fVar51 = in_XMM2_Dd * in_XMM6_Dd + in_XMM13_Dd * in_XMM4_Dd;
    fVar16 = in_XMM2_Dd * in_XMM6_Dd - in_XMM13_Dd * in_XMM4_Dd;
    fVar49 = fVar49 + fVar49;
    fVar28 = fVar28 + fVar28;
    fVar53 = in_XMM6_Dd * in_XMM6_Dd + fVar53 + -in_XMM2_Dd * in_XMM2_Dd;
    fVar40 = fVar39 * 1.0 + fVar49 * 0.0 + fVar28 * 0.0;
    fVar27 = fVar39 * 0.0 + fVar49 * 1.0 + fVar28 * 0.0;
    fVar28 = fVar39 * 0.0 + fVar49 * 0.0 + fVar28 * 1.0;
    fVar51 = fVar51 + fVar51;
    fVar46 = fVar46 + fVar46;
    fVar39 = fVar46 * 1.0 + fVar47 * 0.0 + fVar51 * 0.0;
    fVar49 = fVar46 * 0.0 + fVar47 * 1.0 + fVar51 * 0.0;
    fVar46 = fVar46 * 0.0 + fVar47 * 0.0 + fVar51 * 1.0;
    fVar43 = fVar43 + fVar43;
    fVar16 = fVar16 + fVar16;
    fVar47 = fVar43 * 1.0 + fVar16 * 0.0 + fVar53 * 0.0;
    fVar51 = fVar43 * 0.0 + fVar16 * 1.0 + fVar53 * 0.0;
    fVar16 = fVar43 * 0.0 + fVar16 * 0.0 + fVar53 * 1.0;
    in_XMM14_Da = in_XMM13_Da * fVar40 + fVar39 * 0.0 + fVar47 * 0.0;
    in_XMM14_Db = in_XMM13_Da * fVar27 + fVar49 * 0.0 + fVar51 * 0.0;
    in_XMM14_Dc = in_XMM13_Da * fVar28 + fVar46 * 0.0 + fVar16 * 0.0;
    a0.field_0._0_4_ = in_XMM2_Da * fVar40 + in_XMM2_Db * fVar39 + fVar47 * 0.0;
    a0.field_0._4_4_ = in_XMM2_Da * fVar27 + in_XMM2_Db * fVar49 + fVar51 * 0.0;
    a0.field_0._8_4_ = in_XMM2_Da * fVar28 + in_XMM2_Db * fVar46 + fVar16 * 0.0;
    auVar18._0_4_ = in_XMM6_Da * fVar40 + in_XMM6_Db * fVar39 + in_XMM6_Dc * fVar47;
    auVar18._4_4_ = in_XMM6_Da * fVar27 + in_XMM6_Db * fVar49 + in_XMM6_Dc * fVar51;
    auVar18._8_4_ = in_XMM6_Da * fVar28 + in_XMM6_Db * fVar46 + in_XMM6_Dc * fVar16;
    auVar33._0_4_ = in_XMM4_Da * fVar40 + in_XMM4_Db * fVar39 + in_XMM4_Dc * fVar47;
    auVar33._4_4_ = in_XMM4_Da * fVar27 + in_XMM4_Db * fVar49 + in_XMM4_Dc * fVar51;
    auVar33._8_4_ = in_XMM4_Da * fVar28 + in_XMM4_Db * fVar46 + in_XMM4_Dc * fVar16;
    fVar16 = in_XMM13_Db;
    fVar39 = in_XMM13_Dc;
  }
  else {
    local_168._0_4_ = (this->super_Geometry).fnumTimeSegments;
    fVar16 = (this->super_Geometry).time_range.lower;
    auVar29._4_8_ = 0;
    auVar29._0_4_ = fVar16;
    fVar53 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar16) /
             ((this->super_Geometry).time_range.upper - fVar16)) * (float)local_168._0_4_;
    fVar16 = floorf(fVar53);
    if ((float)local_168._0_4_ + -1.0 <= fVar16) {
      fVar16 = (float)local_168._0_4_ + -1.0;
    }
    auVar22 = ZEXT812(0);
    if (0.0 <= fVar16) {
      auVar22._4_8_ = 0;
      auVar22._0_4_ = fVar16;
    }
    uVar11 = (uint)auVar22._0_4_;
    fVar53 = fVar53 - auVar22._0_4_;
    pRVar8 = (this->l2w_buf).items;
    pRVar6 = pRVar8 + uVar11;
    RVar4 = pRVar8[uVar11].format;
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = pRVar6->stride * uVar13;
        in_XMM14_Db = *(float *)(pcVar7 + lVar14 + 0x10);
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        fVar16 = *(float *)(pcVar7 + lVar14 + 8);
        in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0xc);
        in_XMM14_Dc = *(float *)(pcVar7 + lVar14 + 0x20);
        auVar22._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x14);
        auVar22._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 4);
        auVar22._8_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x24);
        fVar39 = *(float *)(pcVar7 + lVar14 + 0x18);
        fVar46 = *(float *)(pcVar7 + lVar14 + 0x28);
        in_XMM13_Db = *(float *)(pcVar7 + lVar14 + 0x1c);
        in_XMM13_Dc = *(float *)(pcVar7 + lVar14 + 0x2c);
        auVar29._4_8_ = 0;
        auVar29._0_4_ = in_XMM13_Dc;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = pRVar6->stride * uVar13;
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 4);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
        auVar22._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
        auVar22._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0xc);
        auVar22._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
        fVar16 = *(float *)(pcVar7 + lVar14 + 0x18);
        fVar39 = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
        fVar46 = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
        uVar3 = *(ulong *)(pcVar7 + lVar14 + 0x28);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar3;
        in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0x24);
        in_XMM13_Db = (float)uVar3;
        in_XMM13_Dc = (float)(uVar3 >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = pRVar6->stride * uVar13;
        fVar16 = *(float *)(pcVar7 + lVar14 + 0x10);
        fVar39 = *(float *)((long)(pcVar7 + lVar14 + 0x10) + 4);
        in_XMM14_Da = *(float *)(pcVar7 + lVar14);
        fVar46 = *(float *)(pcVar7 + lVar14 + 8);
        in_XMM6_Db = 0.0;
        in_XMM6_Dc = 0.0;
        auVar24._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 4);
        auVar24._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0xc);
        in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0x18);
        in_XMM13_Db = *(float *)(pcVar7 + lVar14 + 0x1c);
        in_XMM13_Dc = *(float *)((long)(pcVar7 + lVar14 + 0x1c) + 4);
        in_XMM4_Dc = 0.0;
        fVar49 = *(float *)(pcVar7 + lVar14 + 0x2c);
        fVar27 = *(float *)(pcVar7 + lVar14 + 0x30) * *(float *)(pcVar7 + lVar14 + 0x30) +
                 fVar49 * fVar49 +
                 *(float *)(pcVar7 + lVar14 + 0x24) * *(float *)(pcVar7 + lVar14 + 0x24) +
                 *(float *)(pcVar7 + lVar14 + 0x28) * *(float *)(pcVar7 + lVar14 + 0x28);
        auVar20 = rsqrtss(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
        fVar40 = auVar20._0_4_;
        auVar36._0_4_ = fVar49 * (fVar40 * fVar40 * fVar27 * -0.5 * fVar40 + fVar40 * 1.5);
        auVar36._4_8_ = 0;
        in_XMM14_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
        in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
        auVar29._0_8_ = CONCAT44(auVar36._0_4_,*(undefined4 *)(pcVar7 + lVar14 + 0x3c));
        auVar29._8_4_ = 0;
        auVar24._8_8_ = auVar29._0_8_;
        auVar22 = auVar24._0_12_;
        in_XMM4_Da = in_XMM13_Db;
        in_XMM4_Db = in_XMM13_Dc;
        in_XMM6_Da = fVar46;
      }
      else {
        fVar39 = extraout_XMM0_Db;
        fVar46 = extraout_XMM0_Dc;
        if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar14 = pRVar6->stride * uVar13;
          pfVar2 = (float *)(pcVar7 + lVar14);
          in_XMM14_Da = *pfVar2;
          in_XMM14_Db = pfVar2[1];
          in_XMM14_Dc = pfVar2[2];
          auVar22 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14 + 0x10),0);
          pfVar2 = (float *)(pcVar7 + lVar14 + 0x20);
          fVar16 = *pfVar2;
          fVar39 = pfVar2[1];
          fVar46 = pfVar2[2];
          pfVar2 = (float *)(pcVar7 + lVar14 + 0x30);
          in_XMM13_Da = *pfVar2;
          in_XMM13_Db = pfVar2[1];
          in_XMM13_Dc = pfVar2[2];
        }
      }
      pRVar6 = pRVar8 + (uVar11 + 1);
      RVar4 = pRVar8[uVar11 + 1].format;
      if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        auVar29._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x10);
        auVar29._0_4_ = *(undefined4 *)(pcVar7 + lVar14);
        in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 4);
        in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 8);
        auVar29._8_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x20);
        in_XMM6_Db = *(float *)(pcVar7 + lVar14 + 0x14);
        in_XMM6_Dc = *(float *)(pcVar7 + lVar14 + 0x24);
        in_XMM4_Db = *(float *)(pcVar7 + lVar14 + 0x18);
        in_XMM4_Dc = *(float *)(pcVar7 + lVar14 + 0x28);
        auVar36._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x1c);
        auVar36._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0xc);
        auVar36._8_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x2c);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        auVar29._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 4);
        auVar29._0_4_ = *(undefined4 *)(pcVar7 + lVar14);
        auVar29._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
        in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 0xc);
        in_XMM6_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
        in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
        in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 0x18);
        in_XMM4_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
        auVar36._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x28);
        auVar36._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x24);
        auVar36._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x28) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        in_XMM4_Da = *(float *)(pcVar7 + lVar14 + 0x10);
        in_XMM4_Db = *(float *)((long)(pcVar7 + lVar14 + 0x10) + 4);
        in_XMM6_Db = *(float *)(pcVar7 + lVar14 + 4);
        in_XMM4_Dc = *(float *)(pcVar7 + lVar14 + 8);
        in_XMM6_Da = *(float *)(pcVar7 + lVar14 + 0xc);
        fVar49 = *(float *)(pcVar7 + lVar14 + 0x30) * *(float *)(pcVar7 + lVar14 + 0x30) +
                 *(float *)(pcVar7 + lVar14 + 0x2c) * *(float *)(pcVar7 + lVar14 + 0x2c) +
                 *(float *)(pcVar7 + lVar14 + 0x24) * *(float *)(pcVar7 + lVar14 + 0x24) +
                 *(float *)(pcVar7 + lVar14 + 0x28) * *(float *)(pcVar7 + lVar14 + 0x28);
        rsqrtss(ZEXT416((uint)fVar49),ZEXT416((uint)fVar49));
        uStack_114 = (undefined4)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
        auVar29._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
        auVar29._0_4_ = *(undefined4 *)(pcVar7 + lVar14);
        auVar29._8_4_ = uStack_114;
        in_XMM6_Dc = *(float *)(pcVar7 + lVar14 + 0x3c);
        auVar36._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
        auVar36._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x18);
        auVar36._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar14 = uVar13 * pRVar6->stride;
        auVar29 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14),0);
        pfVar2 = (float *)(pcVar7 + lVar14 + 0x10);
        in_XMM6_Da = *pfVar2;
        in_XMM6_Db = pfVar2[1];
        in_XMM6_Dc = pfVar2[2];
        pfVar2 = (float *)(pcVar7 + lVar14 + 0x20);
        in_XMM4_Da = *pfVar2;
        in_XMM4_Db = pfVar2[1];
        in_XMM4_Dc = pfVar2[2];
        auVar36 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar14 + 0x30),0);
      }
      fVar49 = 1.0 - fVar53;
      in_XMM14_Da = in_XMM14_Da * fVar49 + auVar29._0_4_ * fVar53;
      in_XMM14_Db = in_XMM14_Db * fVar49 + auVar29._4_4_ * fVar53;
      in_XMM14_Dc = in_XMM14_Dc * fVar49 + auVar29._8_4_ * fVar53;
      a0.field_0._0_4_ = auVar22._0_4_ * fVar49 + in_XMM6_Da * fVar53;
      a0.field_0._4_4_ = auVar22._4_4_ * fVar49 + in_XMM6_Db * fVar53;
      a0.field_0._8_4_ = auVar22._8_4_ * fVar49 + in_XMM6_Dc * fVar53;
      auVar18._0_4_ = fVar16 * fVar49 + in_XMM4_Da * fVar53;
      auVar18._4_4_ = fVar39 * fVar49 + in_XMM4_Db * fVar53;
      auVar18._8_4_ = fVar46 * fVar49 + in_XMM4_Dc * fVar53;
      auVar32._0_4_ = fVar49 * in_XMM13_Da + fVar53 * auVar36._0_4_;
      auVar32._4_4_ = fVar49 * in_XMM13_Db + fVar53 * auVar36._4_4_;
      auVar32._8_4_ = fVar49 * in_XMM13_Dc + fVar53 * auVar36._8_4_;
      goto LAB_0027774a;
    }
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = pRVar6->stride * uVar13;
      local_168._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x10);
      local_168._0_4_ = *(undefined4 *)(pcVar7 + lVar14);
      uStack_160._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x20);
      uStack_160._4_4_ = 0.0;
      local_148._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x14);
      local_148._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 4);
      fStack_140 = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x24);
      fStack_13c = 0.0;
      local_108._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x18);
      local_108._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 8);
      fStack_100 = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x28);
      fStack_fc = 0.0;
      local_128._4_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x1c);
      local_128._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0xc);
      fStack_120 = (float)*(undefined4 *)(pcVar7 + lVar14 + 0x2c);
      fStack_11c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = pRVar6->stride * uVar13;
      local_168._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 4);
      local_168._0_4_ = *(undefined4 *)(pcVar7 + lVar14);
      uStack_160._0_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
      uStack_160._4_4_ = 0.0;
      local_148._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
      local_148._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0xc);
      fStack_140 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
      fStack_13c = 0.0;
      local_108._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
      local_108._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x18);
      fStack_100 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      fStack_fc = 0.0;
      local_128._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar14 + 0x28);
      local_128._0_4_ = *(undefined4 *)(pcVar7 + lVar14 + 0x24);
      fStack_120 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x28) >> 0x20);
      fStack_11c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = pRVar6->stride * uVar13;
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x10);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      in_XMM10_Da = *(float *)(pcVar7 + lVar14);
      in_XMM11_Db = *(float *)(pcVar7 + lVar14 + 4);
      in_XMM12_Dc = *(float *)(pcVar7 + lVar14 + 8);
      in_XMM11_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      in_XMM13_Dd = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM10_Dd = *(float *)(pcVar7 + lVar14 + 0x28);
      in_XMM11_Dd = *(float *)(pcVar7 + lVar14 + 0x2c);
      fVar16 = *(float *)(pcVar7 + lVar14 + 0x30);
      fVar39 = fVar16 * fVar16 +
               in_XMM11_Dd * in_XMM11_Dd + in_XMM13_Dd * in_XMM13_Dd + in_XMM10_Dd * in_XMM10_Dd;
      auVar20 = rsqrtss(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
      fVar46 = auVar20._0_4_;
      in_XMM12_Dd = fVar46 * fVar46 * fVar39 * -0.5 * fVar46 + fVar46 * 1.5;
      in_XMM13_Dd = in_XMM13_Dd * in_XMM12_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM12_Dd;
      in_XMM11_Dd = in_XMM11_Dd * in_XMM12_Dd;
      in_XMM12_Dd = in_XMM12_Dd * fVar16;
      fStack_100 = in_XMM12_Dc;
      local_108 = (undefined1  [8])*(undefined8 *)pfVar2;
      fStack_fc = in_XMM12_Dd;
      in_XMM10_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
      in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
      local_168._4_4_ = in_XMM10_Db;
      local_168._0_4_ = in_XMM10_Da;
      uStack_160._0_4_ = in_XMM10_Dc;
      uStack_160._4_4_ = in_XMM10_Dd;
      in_XMM11_Dc = *(float *)(pcVar7 + lVar14 + 0x3c);
      local_148._4_4_ = in_XMM11_Db;
      local_148._0_4_ = in_XMM11_Da;
      fStack_140 = in_XMM11_Dc;
      fStack_13c = in_XMM11_Dd;
      local_128._4_4_ = in_XMM13_Db;
      local_128._0_4_ = in_XMM13_Da;
      fStack_120 = in_XMM13_Dc;
      fStack_11c = in_XMM13_Dd;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = pRVar6->stride * uVar13;
      _local_168 = *(undefined1 (*) [16])(pcVar7 + lVar14);
      _local_148 = *(undefined1 (*) [16])(pcVar7 + lVar14 + 0x10);
      _local_108 = *(undefined1 (*) [16])(pcVar7 + lVar14 + 0x20);
      _local_128 = *(undefined1 (*) [16])(pcVar7 + lVar14 + 0x30);
    }
    pRVar6 = pRVar8 + (uVar11 + 1);
    RVar4 = pRVar8[uVar11 + 1].format;
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM10_Db = *(float *)(pcVar7 + lVar14 + 0x10);
      in_XMM10_Da = *(float *)(pcVar7 + lVar14);
      in_XMM12_Da = *(float *)(pcVar7 + lVar14 + 4);
      in_XMM11_Da = *(float *)(pcVar7 + lVar14 + 8);
      in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM10_Dc = *(float *)(pcVar7 + lVar14 + 0x20);
      in_XMM10_Dd = 0.0;
      in_XMM12_Db = *(float *)(pcVar7 + lVar14 + 0x14);
      in_XMM12_Dc = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM12_Dd = 0.0;
      in_XMM11_Db = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM11_Dc = *(float *)(pcVar7 + lVar14 + 0x28);
      in_XMM11_Dd = 0.0;
      in_XMM13_Db = *(float *)(pcVar7 + lVar14 + 0x1c);
      in_XMM13_Dc = *(float *)(pcVar7 + lVar14 + 0x2c);
      in_XMM13_Dd = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM10_Da = *(float *)(pcVar7 + lVar14);
      in_XMM10_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 4);
      in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 4) >> 0x20);
      in_XMM10_Dd = 0.0;
      in_XMM12_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM12_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
      in_XMM12_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
      in_XMM12_Dd = 0.0;
      in_XMM11_Da = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      in_XMM11_Dd = 0.0;
      in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x28);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x28) >> 0x20);
      in_XMM13_Dd = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      in_XMM11_Da = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x10);
      in_XMM11_Db = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x10) >> 0x20);
      in_XMM10_Da = *(float *)(pcVar7 + lVar14);
      in_XMM12_Db = *(float *)(pcVar7 + lVar14 + 4);
      in_XMM11_Dc = *(float *)(pcVar7 + lVar14 + 8);
      in_XMM12_Da = *(float *)(pcVar7 + lVar14 + 0xc);
      in_XMM13_Da = *(float *)(pcVar7 + lVar14 + 0x18);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x1c);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x1c) >> 0x20);
      in_XMM13_Dd = *(float *)(pcVar7 + lVar14 + 0x24);
      in_XMM10_Dd = *(float *)(pcVar7 + lVar14 + 0x28);
      in_XMM12_Dd = *(float *)(pcVar7 + lVar14 + 0x2c);
      fVar16 = *(float *)(pcVar7 + lVar14 + 0x30);
      fVar39 = fVar16 * fVar16 +
               in_XMM12_Dd * in_XMM12_Dd + in_XMM13_Dd * in_XMM13_Dd + in_XMM10_Dd * in_XMM10_Dd;
      auVar20 = rsqrtss(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
      fVar46 = auVar20._0_4_;
      in_XMM11_Dd = fVar46 * fVar46 * fVar39 * -0.5 * fVar46 + fVar46 * 1.5;
      in_XMM13_Dd = in_XMM13_Dd * in_XMM11_Dd;
      in_XMM10_Dd = in_XMM10_Dd * in_XMM11_Dd;
      in_XMM12_Dd = in_XMM12_Dd * in_XMM11_Dd;
      in_XMM11_Dd = in_XMM11_Dd * fVar16;
      in_XMM10_Db = (float)*(undefined8 *)(pcVar7 + lVar14 + 0x34);
      in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar7 + lVar14 + 0x34) >> 0x20);
      in_XMM12_Dc = *(float *)(pcVar7 + lVar14 + 0x3c);
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar7 = pRVar6->ptr_ofs;
      lVar14 = uVar13 * pRVar6->stride;
      pfVar2 = (float *)(pcVar7 + lVar14);
      in_XMM10_Da = *pfVar2;
      in_XMM10_Db = pfVar2[1];
      in_XMM10_Dc = pfVar2[2];
      in_XMM10_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x10);
      in_XMM12_Da = *pfVar2;
      in_XMM12_Db = pfVar2[1];
      in_XMM12_Dc = pfVar2[2];
      in_XMM12_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x20);
      in_XMM11_Da = *pfVar2;
      in_XMM11_Db = pfVar2[1];
      in_XMM11_Dc = pfVar2[2];
      in_XMM11_Dd = pfVar2[3];
      pfVar2 = (float *)(pcVar7 + lVar14 + 0x30);
      in_XMM13_Da = *pfVar2;
      in_XMM13_Db = pfVar2[1];
      in_XMM13_Dc = pfVar2[2];
      in_XMM13_Dd = pfVar2[3];
    }
    fVar46 = fStack_fc * in_XMM11_Dd +
             fStack_13c * in_XMM12_Dd + in_XMM13_Dd * fStack_11c + uStack_160._4_4_ * in_XMM10_Dd;
    fVar16 = -fVar46;
    local_f8 = -in_XMM11_Dd;
    local_e8 = in_XMM12_Dd;
    if (fVar46 < fVar16) {
      local_e8 = -in_XMM12_Dd;
    }
    fVar49 = ABS(fVar46);
    fVar39 = fVar16;
    if (fVar16 <= fVar46) {
      fVar39 = fVar46;
    }
    fVar40 = 1.0 - fVar49;
    if (fVar40 < 0.0) {
      fVar40 = sqrtf(fVar40);
    }
    else {
      fVar40 = SQRT(fVar40);
    }
    local_118 = (float)(~-(uint)(fVar46 < fVar16) & (uint)in_XMM11_Dd |
                       (uint)local_f8 & -(uint)(fVar46 < fVar16));
    fVar40 = 1.5707964 -
             fVar40 * (((((fVar49 * -0.0043095737 + 0.0192803) * fVar49 + -0.04489909) * fVar49 +
                        0.08785567) * fVar49 + -0.21450998) * fVar49 + 1.5707952);
    fVar16 = 0.0;
    if (0.0 <= fVar40) {
      fVar16 = fVar40;
    }
    fVar49 = (float)(-(uint)(1.0 < fVar49) & 0x7fc00000 |
                    ~-(uint)(1.0 < fVar49) &
                    (uint)(1.5707964 -
                          (float)((uint)-fVar16 & -(uint)(fVar39 < 0.0) |
                                 ~-(uint)(fVar39 < 0.0) & (uint)fVar16))) * fVar53;
    fVar40 = floorf(fVar49 * 0.63661975);
    fVar49 = fVar49 - fVar40 * 1.5707964;
    fVar16 = fVar49 * fVar49;
    uVar11 = (int)fVar40 & 3;
    fVar27 = ((((fVar16 * -2.5963018e-07 + 2.4756235e-05) * fVar16 + -0.001388833) * fVar16 +
              0.04166664) * fVar16 + -0.5) * fVar16 + 1.0;
    fVar49 = (((((fVar16 * -2.5029328e-08 + 2.7600126e-06) * fVar16 + -0.00019842605) * fVar16 +
               0.008333348) * fVar16 + -0.16666667) * fVar16 + 1.0) * fVar49;
    fVar16 = fVar27;
    if (((int)fVar40 & 1U) != 0) {
      fVar16 = fVar49;
      fVar49 = fVar27;
    }
    if (uVar11 - 1 < 2) {
      fVar16 = -fVar16;
    }
    fVar27 = fVar39 * fStack_13c - local_e8;
    fVar40 = fVar39 * fStack_fc - local_118;
    if (uVar11 < 2) {
      fVar49 = -fVar49;
    }
    fVar28 = 1.0 - fVar53;
    fVar56 = fVar28 * fStack_13c + local_e8 * fVar53;
    fVar43 = fVar28 * fStack_fc + local_118 * fVar53;
    uVar11 = (int)((uint)(fVar46 < 0.0) << 0x1f) >> 0x1f;
    uVar37 = (int)((uint)(fVar46 < 0.0) << 0x1f) >> 0x1f;
    fVar38 = (float)((uint)-in_XMM13_Dd & uVar11 | ~uVar11 & (uint)in_XMM13_Dd);
    fVar44 = (float)((uint)-in_XMM10_Dd & uVar37 | ~uVar37 & (uint)in_XMM10_Dd);
    fVar46 = fVar39 * fStack_11c - fVar38;
    fVar47 = fVar39 * uStack_160._4_4_ - fVar44;
    auVar26._0_8_ = CONCAT44(fStack_fc,fVar40) ^ 0x8000000000000000;
    auVar26._8_4_ = -fStack_fc;
    auVar26._12_4_ = -fStack_fc;
    auVar31._4_12_ = auVar26._4_12_;
    auVar31._0_4_ = fVar40 * fVar40 + fVar27 * fVar27 + fVar46 * fVar46 + fVar47 * fVar47;
    auVar20._0_8_ = CONCAT44(fStack_fc,auVar31._0_4_) ^ 0x8000000000000000;
    auVar20._8_4_ = -fStack_fc;
    auVar20._12_4_ = -fStack_fc;
    auVar20 = rsqrtss(auVar20,auVar31);
    fVar51 = auVar20._0_4_;
    fVar41 = fVar51 * fVar51 * auVar31._0_4_ * -0.5 * fVar51 + fVar51 * 1.5;
    fVar51 = fStack_11c * fVar28 + fVar38 * fVar53;
    fVar38 = uStack_160._4_4_ * fVar28 + fVar44 * fVar53;
    fVar50 = fVar43 * fVar43 + fVar56 * fVar56 + fVar51 * fVar51 + fVar38 * fVar38;
    auVar20 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
    fVar44 = auVar20._0_4_;
    fVar44 = fVar44 * fVar44 * fVar50 * -0.5 * fVar44 + fVar44 * 1.5;
    uVar11 = (int)((uint)(0.9995 < fVar39) << 0x1f) >> 0x1f;
    uVar37 = (int)((uint)(0.9995 < fVar39) << 0x1f) >> 0x1f;
    fVar46 = (float)(~uVar11 & (uint)(fVar16 * fStack_11c + fVar49 * fVar41 * fVar46) |
                    (uint)(fVar44 * fVar51) & uVar11);
    fVar47 = (float)(~uVar37 & (uint)(fVar16 * uStack_160._4_4_ + fVar49 * fVar41 * fVar47) |
                    (uint)(fVar44 * fVar38) & uVar37);
    if (0.9995 < fVar39) {
      fVar56 = fVar56 * fVar44;
      fVar43 = fVar43 * fVar44;
    }
    else {
      fVar56 = fStack_13c * fVar16 + fVar27 * fVar41 * fVar49;
      fVar43 = fStack_fc * fVar16 + fVar40 * fVar41 * fVar49;
    }
    fVar54 = (float)local_168._0_4_ * fVar28 + in_XMM10_Da * fVar53;
    fVar16 = (float)local_168._4_4_ * fVar28 + in_XMM10_Db * fVar53;
    fVar39 = (float)uStack_160 * fVar28 + in_XMM10_Dc * fVar53;
    fVar49 = (float)local_148._0_4_ * fVar28 + in_XMM12_Da * fVar53;
    fVar40 = (float)local_148._4_4_ * fVar28 + in_XMM12_Db * fVar53;
    in_XMM2_Dc = fStack_140 * fVar28 + in_XMM12_Dc * fVar53;
    fVar38 = (float)local_108._0_4_ * fVar28 + in_XMM11_Da * fVar53;
    fVar41 = (float)local_108._4_4_ * fVar28 + in_XMM11_Db * fVar53;
    fVar44 = fStack_100 * fVar28 + in_XMM11_Dc * fVar53;
    fVar27 = (float)local_128._0_4_ * fVar28 + in_XMM13_Da * fVar53;
    fVar51 = (float)local_128._4_4_ * fVar28 + in_XMM13_Db * fVar53;
    fVar28 = fStack_120 * fVar28 + in_XMM13_Dc * fVar53;
    fVar42 = fVar47 * fVar56 + fVar46 * fVar43;
    fVar34 = fVar47 * fVar56 - fVar46 * fVar43;
    fVar50 = fVar46 * fVar46 + fVar47 * fVar47 + -fVar56 * fVar56 + -fVar43 * fVar43;
    fVar53 = fVar46 * fVar46 - fVar47 * fVar47;
    fVar45 = fVar56 * fVar56 + fVar53 + -fVar43 * fVar43;
    fVar52 = fVar47 * fVar43 - fVar46 * fVar56;
    fVar35 = fVar46 * fVar56 + fVar47 * fVar43;
    fVar48 = fVar56 * fVar43 + fVar46 * fVar47;
    fVar57 = fVar56 * fVar43 - fVar46 * fVar47;
    fVar42 = fVar42 + fVar42;
    fVar52 = fVar52 + fVar52;
    fVar53 = fVar43 * fVar43 + fVar53 + -fVar56 * fVar56;
    fVar46 = fVar50 * 1.0 + fVar42 * 0.0 + fVar52 * 0.0;
    fVar43 = fVar50 * 0.0 + fVar42 * 1.0 + fVar52 * 0.0;
    fVar47 = fVar50 * 0.0 + fVar42 * 0.0 + fVar52 * 1.0;
    fVar48 = fVar48 + fVar48;
    fVar34 = fVar34 + fVar34;
    fVar50 = fVar34 * 1.0 + fVar45 * 0.0 + fVar48 * 0.0;
    fVar56 = fVar34 * 0.0 + fVar45 * 1.0 + fVar48 * 0.0;
    fVar34 = fVar34 * 0.0 + fVar45 * 0.0 + fVar48 * 1.0;
    fVar35 = fVar35 + fVar35;
    fVar57 = fVar57 + fVar57;
    fVar42 = fVar35 * 1.0 + fVar57 * 0.0 + fVar53 * 0.0;
    fVar45 = fVar35 * 0.0 + fVar57 * 1.0 + fVar53 * 0.0;
    fVar53 = fVar35 * 0.0 + fVar57 * 0.0 + fVar53 * 1.0;
    in_XMM14_Da = fVar54 * fVar46 + fVar50 * 0.0 + fVar42 * 0.0;
    in_XMM14_Db = fVar54 * fVar43 + fVar56 * 0.0 + fVar45 * 0.0;
    in_XMM14_Dc = fVar54 * fVar47 + fVar34 * 0.0 + fVar53 * 0.0;
    a0.field_0._0_4_ = fVar49 * fVar46 + fVar40 * fVar50 + fVar42 * 0.0;
    a0.field_0._4_4_ = fVar49 * fVar43 + fVar40 * fVar56 + fVar45 * 0.0;
    a0.field_0._8_4_ = fVar49 * fVar47 + fVar40 * fVar34 + fVar53 * 0.0;
    auVar18._0_4_ = fVar38 * fVar46 + fVar41 * fVar50 + fVar44 * fVar42;
    auVar18._4_4_ = fVar38 * fVar43 + fVar41 * fVar56 + fVar44 * fVar45;
    auVar18._8_4_ = fVar38 * fVar47 + fVar41 * fVar34 + fVar44 * fVar53;
    auVar33._0_4_ = fVar27 * fVar46 + fVar51 * fVar50 + fVar28 * fVar42;
    auVar33._4_4_ = fVar27 * fVar43 + fVar51 * fVar56 + fVar28 * fVar45;
    auVar33._8_4_ = fVar27 * fVar47 + fVar51 * fVar34 + fVar28 * fVar53;
  }
  auVar32._0_4_ = auVar33._0_4_ + fVar16 + 0.0;
  auVar32._4_4_ = auVar33._4_4_ + fVar39 + 0.0;
  auVar32._8_4_ = auVar33._8_4_ + in_XMM2_Dc + 0.0;
LAB_0027774a:
  fVar16 = auVar18._0_4_;
  fVar53 = auVar18._4_4_;
  fVar46 = auVar18._8_4_;
  fVar39 = a0.field_0._0_4_;
  fVar49 = a0.field_0._4_4_;
  fVar40 = a0.field_0._8_4_;
  auVar25._0_4_ = fVar39 * fVar53 - fVar49 * fVar16;
  fVar27 = fVar49 * fVar46 - fVar40 * fVar53;
  fVar28 = fVar40 * fVar16 - fVar39 * fVar46;
  auVar19._4_4_ = fVar53 * in_XMM14_Dc - fVar46 * in_XMM14_Db;
  auVar25._4_4_ = fVar16 * in_XMM14_Db - fVar53 * in_XMM14_Da;
  auVar25._8_4_ = in_XMM14_Da * fVar49 - in_XMM14_Db * fVar39;
  auVar25._12_4_ = 0;
  auVar19._0_4_ = fVar27;
  auVar19._8_4_ = in_XMM14_Db * fVar40 - in_XMM14_Dc * fVar49;
  auVar19._12_4_ = 0;
  auVar30._4_4_ = fVar46 * in_XMM14_Da - fVar16 * in_XMM14_Dc;
  auVar30._0_4_ = fVar28;
  auVar30._8_4_ = in_XMM14_Dc * fVar39 - in_XMM14_Da * fVar40;
  auVar30._12_4_ = 0;
  auVar55._0_4_ = in_XMM14_Dc * auVar25._0_4_ + in_XMM14_Db * fVar28 + in_XMM14_Da * fVar27;
  auVar55._4_4_ = auVar55._0_4_;
  auVar55._8_4_ = auVar55._0_4_;
  auVar55._12_4_ = auVar55._0_4_;
  auVar20 = divps(auVar19,auVar55);
  auVar31 = divps(auVar30,auVar55);
  auVar26 = divps(auVar25,auVar55);
  fVar35 = auVar32._0_4_;
  fVar42 = auVar32._4_4_;
  fVar45 = auVar32._8_4_;
  fVar38 = auVar26._0_4_;
  fVar41 = auVar26._4_4_;
  fVar44 = auVar26._8_4_;
  fVar50 = auVar31._0_4_;
  fVar56 = auVar31._4_4_;
  fVar34 = auVar31._8_4_;
  fVar43 = auVar20._0_4_;
  fVar47 = auVar20._4_4_;
  fVar51 = auVar20._8_4_;
  fVar16 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar53 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar46 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar32 = *(undefined1 (*) [12])&(ray->super_RayK<1>).org.field_0;
  fVar39 = (ray->super_RayK<1>).org.field_0.m128[3];
  aVar9 = (ray->super_RayK<1>).org.field_0;
  pVVar1 = &(ray->super_RayK<1>).dir;
  fVar49 = (pVVar1->field_0).m128[0];
  fVar40 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar27 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar36 = *(undefined1 (*) [12])&pVVar1->field_0;
  fVar28 = (ray->super_RayK<1>).dir.field_0.m128[3];
  aVar10 = pVVar1->field_0;
  (ray->super_RayK<1>).org.field_0.m128[0] =
       fVar16 * fVar43 +
       fVar53 * fVar50 + (fVar46 * fVar38 - (fVar35 * fVar43 + fVar42 * fVar50 + fVar45 * fVar38));
  (ray->super_RayK<1>).org.field_0.m128[1] =
       fVar16 * fVar47 +
       fVar53 * fVar56 + (fVar46 * fVar41 - (fVar35 * fVar47 + fVar42 * fVar56 + fVar45 * fVar41));
  (ray->super_RayK<1>).org.field_0.m128[2] =
       fVar16 * fVar51 +
       fVar53 * fVar34 + (fVar46 * fVar44 - (fVar35 * fVar51 + fVar42 * fVar34 + fVar45 * fVar44));
  (ray->super_RayK<1>).org.field_0.m128[3] = fVar39;
  (ray->super_RayK<1>).dir.field_0.m128[0] = fVar49 * fVar43 + fVar40 * fVar50 + fVar27 * fVar38;
  (ray->super_RayK<1>).dir.field_0.m128[1] = fVar49 * fVar47 + fVar40 * fVar56 + fVar27 * fVar41;
  (ray->super_RayK<1>).dir.field_0.m128[2] = fVar49 * fVar51 + fVar40 * fVar34 + fVar27 * fVar44;
  (ray->super_RayK<1>).dir.field_0.m128[3] = fVar28;
  (**(code **)&pAVar12->field_0x78)(&(pAVar12->super_AccelData).field_0x58,ray);
  local_158 = auVar32._0_8_;
  uStack_150 = aVar9._8_8_;
  *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_158;
  *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_150;
  local_168 = auVar36._0_8_;
  uStack_160 = aVar10._8_8_;
  *(undefined1 (*) [8])&(ray->super_RayK<1>).dir.field_0 = local_168;
  *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_160;
  pRVar5->instID[0] = 0xffffffff;
  pRVar5->instPrimID[0] = 0xffffffff;
  return;
}

Assistant:

void InstanceArrayIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }